

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O1

bool __thiscall
draco::Options::GetVector<float>(Options *this,string *name,int num_dims,float *out_val)

{
  const_iterator cVar1;
  _Rb_tree_header *p_Var2;
  long *__nptr;
  long lVar3;
  bool bVar4;
  float fVar5;
  char *next_str;
  string value;
  long *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,name);
  p_Var2 = &(this->options_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar1._M_node != p_Var2) {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,*(long *)(cVar1._M_node + 2),
               (long)&(cVar1._M_node[2]._M_parent)->_M_color + *(long *)(cVar1._M_node + 2));
    if ((local_48 != 0) && (0 < num_dims)) {
      __nptr = local_50;
      lVar3 = 0;
      do {
        fVar5 = strtof((char *)__nptr,(char **)&local_58);
        if (__nptr == local_58) break;
        out_val[lVar3] = fVar5;
        bVar4 = (ulong)(uint)num_dims - 1 != lVar3;
        __nptr = local_58;
        lVar3 = lVar3 + 1;
      } while (bVar4);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  return (_Rb_tree_header *)cVar1._M_node != p_Var2;
}

Assistant:

bool Options::GetVector(const std::string &name, int num_dims,
                        DataTypeT *out_val) const {
  const auto it = options_.find(name);
  if (it == options_.end()) {
    return false;
  }
  const std::string value = it->second;
  if (value.length() == 0) {
    return true;  // Option set but no data is present
  }
  const char *act_str = value.c_str();
  char *next_str;
  for (int i = 0; i < num_dims; ++i) {
    if (std::is_integral<DataTypeT>::value) {
#ifdef ANDROID
      const int val = strtol(act_str, &next_str, 10);
#else
      const int val = static_cast<int>(std::strtol(act_str, &next_str, 10));
#endif
      if (act_str == next_str) {
        return true;  // End reached.
      }
      act_str = next_str;
      out_val[i] = static_cast<DataTypeT>(val);
    } else {
#ifdef ANDROID
      const float val = strtof(act_str, &next_str);
#else
      const float val = std::strtof(act_str, &next_str);
#endif
      if (act_str == next_str) {
        return true;  // End reached.
      }
      act_str = next_str;
      out_val[i] = static_cast<DataTypeT>(val);
    }
  }
  return true;
}